

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inipp.h
# Opt level: O3

bool inipp::extract<char,bool>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,bool *dst)

{
  uint *puVar1;
  istream *piVar2;
  bool bVar3;
  bool result;
  char c;
  basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_> is;
  bool local_192;
  char local_191;
  long local_190 [3];
  uint auStack_178 [24];
  ios_base local_118 [264];
  
  std::__cxx11::istringstream::istringstream((istringstream *)local_190,(string *)value,_S_in);
  puVar1 = (uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18));
  *puVar1 = *puVar1 | 1;
  piVar2 = std::istream::_M_extract<bool>((bool *)local_190);
  if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0) {
    piVar2 = std::operator>>((istream *)local_190,&local_191);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) {
      *dst = local_192;
      bVar3 = true;
      goto LAB_0010ca59;
    }
  }
  bVar3 = false;
LAB_0010ca59:
  std::__cxx11::istringstream::~istringstream((istringstream *)local_190);
  std::ios_base::~ios_base(local_118);
  return bVar3;
}

Assistant:

inline bool extract(const std::basic_string<CharT> & value, T & dst) {
	CharT c;
	std::basic_istringstream<CharT> is{ value };
	T result;
	if ((is >> std::boolalpha >> result) && !(is >> c)) {
		dst = result;
		return true;
	}
	else {
		return false;
	}
}